

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_neg(secp256k1_gej *r,secp256k1_gej *a)

{
  void *in_RSI;
  void *in_RDI;
  
  secp256k1_gej_verify((secp256k1_gej *)0x10c4f8);
  *(undefined4 *)((long)in_RDI + 0x78) = *(undefined4 *)((long)in_RSI + 0x78);
  memcpy(in_RDI,in_RSI,0x28);
  memcpy((void *)((long)in_RDI + 0x28),(void *)((long)in_RSI + 0x28),0x28);
  memcpy((void *)((long)in_RDI + 0x50),(void *)((long)in_RSI + 0x50),0x28);
  secp256k1_fe_impl_normalize_weak((secp256k1_fe *)((long)in_RDI + 0x28));
  secp256k1_fe_impl_negate_unchecked
            ((secp256k1_fe *)((long)in_RDI + 0x28),(secp256k1_fe *)((long)in_RDI + 0x28),1);
  secp256k1_gej_verify((secp256k1_gej *)0x10c588);
  return;
}

Assistant:

static void secp256k1_gej_neg(secp256k1_gej *r, const secp256k1_gej *a) {
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;
    r->x = a->x;
    r->y = a->y;
    r->z = a->z;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);

    SECP256K1_GEJ_VERIFY(r);
}